

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O0

void cubeb_log_set(cubeb_log_level log_level,cubeb_log_callback log_callback)

{
  atomic<void_(*)(const_char_*,____)> *in_RSI;
  int in_EDI;
  cubeb_async_logger *unaff_retaddr;
  undefined4 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffe8;
  cubeb_log_level in_stack_ffffffffffffffec;
  
  std::atomic<cubeb_log_level>::operator=
            ((atomic<cubeb_log_level> *)in_RSI,in_stack_ffffffffffffffec);
  if ((in_RSI == (atomic<void_(*)(const_char_*,____)> *)0x0) || (in_EDI == 0)) {
    if (in_RSI == (atomic<void_(*)(const_char_*,____)> *)0x0) {
      std::atomic<void_(*)(const_char_*,_...)>::operator=
                ((atomic<void_(*)(const_char_*,____)> *)0x0,
                 (__pointer_type)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      cubeb_async_logger::get();
      cubeb_async_logger::stop((cubeb_async_logger *)CONCAT44(log_level,in_stack_00000010));
    }
  }
  else {
    std::atomic<void_(*)(const_char_*,_...)>::operator=
              (in_RSI,(__pointer_type)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
    ;
    cubeb_async_logger::get();
    cubeb_async_logger::start(unaff_retaddr);
  }
  return;
}

Assistant:

void
cubeb_log_set(cubeb_log_level log_level, cubeb_log_callback log_callback)
{
  g_cubeb_log_level = log_level;
  // Once a callback has a been set, `g_cubeb_log_callback` is never set back to
  // nullptr, to prevent a TOCTOU race between checking the pointer
  if (log_callback && log_level != CUBEB_LOG_DISABLED) {
    g_cubeb_log_callback = log_callback;
    cubeb_async_logger::get().start();
  } else if (!log_callback || CUBEB_LOG_DISABLED) {
    g_cubeb_log_callback = cubeb_noop_log_callback;
    // This returns once the thread has joined.
    cubeb_async_logger::get().stop();
  } else {
    assert(false && "Incorrect parameters passed to cubeb_log_set");
  }
}